

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

float deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::getExpectedValue
                (DataType type,int id,char *name)

{
  deUint32 dVar1;
  uint uVar2;
  
  dVar1 = deStringHash(name);
  uVar2 = ((uint)id >> 0x10 ^ id ^ 0x3d) * 9;
  uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
  uVar2 = (uVar2 >> 0xf ^ uVar2) + dVar1;
  if (type - TYPE_SAMPLER_1D < 0x1e) {
    if (type - TYPE_SAMPLER_1D < 6) goto LAB_012cceea;
    if (5 < type - TYPE_INT_SAMPLER_1D) {
      if (type - TYPE_UINT_SAMPLER_1D < 6) goto LAB_012cced3;
      type = (DataType)(type - TYPE_SAMPLER_1D_SHADOW < 5);
      goto LAB_012cceba;
    }
  }
  else {
LAB_012cceba:
    if (3 < type - TYPE_INT) {
      if (type - TYPE_UINT < 4) {
LAB_012cced3:
        return (float)(uVar2 % 0xff);
      }
      if (type - TYPE_FLOAT < 4) {
LAB_012cceea:
        return (float)(uVar2 % 0xff) / 255.0;
      }
      if (3 < type - TYPE_BOOL) {
        return 0.0;
      }
      uVar2 = uVar2 & 1;
      goto LAB_012ccec5;
    }
  }
  uVar2 = uVar2 & 0x7f;
LAB_012ccec5:
  return (float)uVar2;
}

Assistant:

float UniformLocationCase::getExpectedValue (glu::DataType type, int id, const char* name)
{
	const deUint32	hash			= deStringHash(name) + deInt32Hash(id);

	glu::DataType	adjustedType	= type;

	if (glu::isDataTypeSampler(type))
		adjustedType = getDataTypeSamplerSampleType(type);

	if (glu::isDataTypeIntOrIVec(adjustedType))
		return float(hash%128);
	else if (glu::isDataTypeUintOrUVec(adjustedType))
		return float(hash%255);
	else if (glu::isDataTypeFloatOrVec(adjustedType))
		return float(hash%255)/255.0f;
	else if (glu::isDataTypeBoolOrBVec(adjustedType))
		return float(hash%2);
	else
		DE_FATAL("Unkown primitive type");

	return glu::TYPE_INVALID;
}